

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
mxx::impl::
sample_block_decomp<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,impl *this,long begin,
          size_type_conflict end,comm *param_5)

{
  impl *piVar1;
  long lVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  value_type my_splitter;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  vector<int,_std::allocator<int>_> local_splitters;
  allocator_type local_6d;
  int local_6c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  vector<int,_std::allocator<int>_> local_50;
  value_type_conflict2 local_38;
  
  if (begin - (long)this == 0) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_50);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
           (ulong)(uint)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
           "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
           ,0xa1,"sample_block_decomp","local_size > 0");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_50,end,(allocator_type *)&local_68);
  lVar2 = CONCAT44(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_,
                   (uint)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
  if ((long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish - lVar2 != 0) {
    uVar6 = begin - (long)this >> 2;
    lVar4 = (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - lVar2 >> 2;
    uVar5 = 0;
    do {
      piVar1 = this + ((uVar6 / (end + 1) - 1) + (ulong)(uVar5 < uVar6 % (end + 1))) * 4;
      this = piVar1 + 4;
      *(undefined4 *)(lVar2 + uVar5 * 4) = *(undefined4 *)piVar1;
      uVar5 = uVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != uVar5);
  }
  bitonic_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
            (lVar2,local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,param_5);
  local_6c = local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish[-1];
  local_38 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_68,(long)param_5->m_size,&local_38,&local_6d);
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish[-1] = 0;
  allgatherv<int>(__return_storage_ptr__,&local_6c,(ulong)(param_5->m_rank + 1 < param_5->m_size),
                  &local_68,param_5);
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT44(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (uint)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_block_decomp(_Iterator begin, _Iterator end, _Compare comp, size_t s, const mxx::comm& comm) {
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    size_t local_size = std::distance(begin, end);
    MXX_ASSERT(local_size > 0);

    // 1. samples
    //  - pick `s` samples equally spaced such that `s` samples define `s+1`
    //    subsequences in the sorted order
    std::vector<value_type> local_splitters(s);
    _Iterator pos = begin;
    for (size_t i = 0; i < local_splitters.size(); ++i) {
        size_t bucket_size = local_size / (s+1) + (i < (local_size % (s+1)) ? 1 : 0);
        // pick last element of each bucket
        pos += (bucket_size-1);
        local_splitters[i] = *pos;
        ++pos;
    }

    // sort splitters using parallel bitonic sort
    bitonic_sort(local_splitters.begin(), local_splitters.end(), comp, comm);

    // select the last element on each process but the last
    value_type my_splitter = local_splitters.back();
    // allgather splitters (from all but the last processor)
    std::vector<size_t> recv_sizes(comm.size(), 1);
    recv_sizes.back() = 0;
    std::vector<value_type> result_splitters = mxx::allgatherv(&my_splitter, (comm.rank() + 1 < comm.size()) ? 1 : 0, recv_sizes, comm);

    // return resulting splitters
    return result_splitters;
}